

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactTriangleXYZ::ComputeJacobianForContactPart
          (ChContactTriangleXYZ *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *__dest;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *__dest_00;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *__dest_01;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2> *__dest_02;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2> *__dest_03;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2> *__dest_04;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars3> *__dest_05;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars3> *__dest_06;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars3> *__dest_07;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  bool is_into;
  type_constraint_tuple *local_c8;
  type_constraint_tuple *local_c0;
  ChMatrix33<double> Jx1;
  double s3;
  double s2;
  double local_60;
  ChVector<double> p_projected;
  ChMatrix33<double> *local_38;
  
  p_projected.m_data[0] = 0.0;
  p_projected.m_data[1] = 0.0;
  p_projected.m_data[2] = 0.0;
  peVar1 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar2 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_01 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  peVar3 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_02 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  local_c8 = jacobian_tuple_U;
  local_c0 = jacobian_tuple_V;
  collision::utils::PointTriangleDistance
            (abs_point,(ChVector<double> *)&(peVar1->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)&(peVar2->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)&(peVar3->super_ChNodeFEAbase).field_0x20,&s2,&s3,&is_into,
             &p_projected);
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_60 = (1.0 - s2) - s3;
  local_38 = contact_plane;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&Jx1,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_38)
  ;
  if (!second) {
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar8._0_8_ = -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8];
    auVar8._8_8_ = 0x8000000000000000;
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)vmovlpd_avx(auVar8);
  }
  __dest = &jacobian_tuple_N->Cq_1;
  uVar7 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest,&Jx1,(ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(jacobian_tuple_N->Cq_1).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4),0x18 - uVar4);
  }
  __dest_00 = &local_c8->Cq_1;
  uVar7 = -((uint)((ulong)__dest_00 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_00,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 3,
           (ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(local_c8->Cq_1).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4 + 0x18),0x18 - uVar4);
  }
  __dest_01 = &local_c0->Cq_1;
  uVar7 = -((uint)((ulong)__dest_01 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_01,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6,
           (ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(local_c0->Cq_1).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4 + 0x30),0x18 - uVar4);
  }
  uVar5 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
      [uVar6] = local_60 *
                (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
      [uVar4] = local_60 *
                (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar5 = -((uint)((ulong)__dest_00 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = local_60 *
                     (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                     m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = local_60 *
                     (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                     m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar5 = -((uint)((ulong)__dest_01 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = local_60 *
                     (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                     m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = local_60 *
                     (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                     m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  __dest_02 = &jacobian_tuple_N->Cq_2;
  uVar7 = -((uint)((ulong)__dest_02 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_02,&Jx1,(ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(jacobian_tuple_N->Cq_2).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4),0x18 - uVar4);
  }
  __dest_03 = &local_c8->Cq_2;
  uVar7 = -((uint)((ulong)__dest_03 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_03,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 3,
           (ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(local_c8->Cq_2).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4 + 0x18),0x18 - uVar4);
  }
  __dest_04 = &local_c0->Cq_2;
  uVar7 = -((uint)((ulong)__dest_04 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_04,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6,
           (ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(local_c0->Cq_2).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4 + 0x30),0x18 - uVar4);
  }
  uVar5 = -((uint)((ulong)__dest_02 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = s2 * (__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = s2 * (__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar5 = -((uint)((ulong)__dest_03 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = s2 * (__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = s2 * (__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar5 = -((uint)((ulong)__dest_04 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = s2 * (__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = s2 * (__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  __dest_05 = &jacobian_tuple_N->Cq_3;
  uVar7 = -((uint)((ulong)__dest_05 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_05,&Jx1,(ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(jacobian_tuple_N->Cq_3).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4),0x18 - uVar4);
  }
  __dest_06 = &local_c8->Cq_3;
  uVar7 = -((uint)((ulong)__dest_06 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_06,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 3,
           (ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(local_c8->Cq_3).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4 + 0x18),0x18 - uVar4);
  }
  __dest_07 = &local_c0->Cq_3;
  uVar7 = -((uint)((ulong)__dest_07 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(__dest_07,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6,
           (ulong)(uVar5 * 8));
  }
  if (uVar7 < 3) {
    uVar4 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)(local_c0->Cq_3).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar4),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar4 + 0x30),0x18 - uVar4);
  }
  uVar5 = -((uint)((ulong)__dest_05 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = s3 * (__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = s3 * (__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar5 = -((uint)((ulong)__dest_06 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = s3 * (__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = s3 * (__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar5 = -((uint)((ulong)__dest_07 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if ((ulong)uVar5 < 3) {
    uVar4 = (ulong)uVar5;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      (__dest_07->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar6] = s3 * (__dest_07->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      (__dest_07->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
      array[uVar4] = s3 * (__dest_07->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

void ChContactTriangleXYZ::ComputeJacobianForContactPart(const ChVector<>& abs_point,
                                                         ChMatrix33<>& contact_plane,
                                                         type_constraint_tuple& jacobian_tuple_N,
                                                         type_constraint_tuple& jacobian_tuple_U,
                                                         type_constraint_tuple& jacobian_tuple_V,
                                                         bool second) {
    // compute the triangular area-parameters s1 s2 s3:
    double s2, s3;
    bool is_into;
    ChVector<> p_projected;
    /*double dist =*/collision::utils::PointTriangleDistance(abs_point, GetNode1()->pos, GetNode2()->pos,
                                                             GetNode3()->pos, s2, s3, is_into, p_projected);
    double s1 = 1 - s2 - s3;

    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;

    jacobian_tuple_N.Get_Cq_1().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq_1().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq_1().segment(0, 3) = Jx1.row(2);
    jacobian_tuple_N.Get_Cq_1() *= s1;
    jacobian_tuple_U.Get_Cq_1() *= s1;
    jacobian_tuple_V.Get_Cq_1() *= s1;
    jacobian_tuple_N.Get_Cq_2().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq_2().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq_2().segment(0, 3) = Jx1.row(2);
    jacobian_tuple_N.Get_Cq_2() *= s2;
    jacobian_tuple_U.Get_Cq_2() *= s2;
    jacobian_tuple_V.Get_Cq_2() *= s2;
    jacobian_tuple_N.Get_Cq_3().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq_3().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq_3().segment(0, 3) = Jx1.row(2);
    jacobian_tuple_N.Get_Cq_3() *= s3;
    jacobian_tuple_U.Get_Cq_3() *= s3;
    jacobian_tuple_V.Get_Cq_3() *= s3;
}